

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O2

ParseState
icu_63::number::impl::skeleton::parseStem
          (StringSegment *segment,UCharsTrie *stemTrie,SeenMacroProps *seen,MacroProps *macros,
          UErrorCode *status)

{
  FractionSignificantSettings FVar1;
  char16_t cVar2;
  UStringTrieResult UVar3;
  StemEnum stem;
  UNumberFormatRoundingMode UVar4;
  UNumberSignDisplay UVar5;
  UGroupingStrategy grouping;
  UNumberUnitWidth UVar6;
  UNumberDecimalSeparatorDisplay UVar7;
  NumberingSystem *ns;
  Notation NVar8;
  Grouper GVar9;
  Precision local_50;
  
  cVar2 = numparse::impl::StringSegment::charAt(segment,0);
  if (cVar2 == L'@') {
    if (seen->precision != true) {
      seen->precision = true;
      blueprint_helpers::parseDigitsStem(segment,macros,status);
      return STATE_NULL;
    }
  }
  else if (cVar2 == L'.') {
    if (seen->precision != true) {
      seen->precision = true;
      blueprint_helpers::parseFractionStem(segment,macros,status);
      return STATE_FRACTION_PRECISION;
    }
  }
  else {
    UVar3 = UCharsTrie::current(stemTrie);
    if (0xfffffffd < UVar3 + ~USTRINGTRIE_INTERMEDIATE_VALUE) {
      stem = UCharsTrie::getValue(stemTrie);
      switch(stem) {
      case STEM_COMPACT_SHORT:
      case STEM_COMPACT_LONG:
      case STEM_SCIENTIFIC:
      case STEM_ENGINEERING:
      case STEM_NOTATION_SIMPLE:
        if (seen->notation != true) {
          seen->notation = true;
          NVar8 = stem_to_object::notation(stem);
          macros->notation = NVar8;
          return (uint)((stem & ~STEM_COMPACT_LONG) == STEM_SCIENTIFIC);
        }
        break;
      case STEM_BASE_UNIT:
      case STEM_PERCENT:
      case STEM_PERMILLE:
        if (seen->unit != true) {
          seen->unit = true;
          stem_to_object::unit((MeasureUnit *)&local_50,stem);
          MeasureUnit::operator=(&macros->unit,(MeasureUnit *)&local_50);
          MeasureUnit::~MeasureUnit((MeasureUnit *)&local_50);
          return STATE_NULL;
        }
        break;
      case STEM_PRECISION_INTEGER:
      case STEM_PRECISION_UNLIMITED:
      case STEM_PRECISION_CURRENCY_STANDARD:
      case STEM_PRECISION_CURRENCY_CASH:
        if (seen->precision != true) {
          seen->precision = true;
          stem_to_object::precision(&local_50,stem);
          FVar1.fMinSig = local_50.fUnion.fracSig.fMinSig;
          FVar1.fMaxSig = local_50.fUnion.fracSig.fMaxSig;
          FVar1.fMinFrac = local_50.fUnion.fracSig.fMinFrac;
          FVar1.fMaxFrac = local_50.fUnion.fracSig.fMaxFrac;
          *(ulong *)((long)&(macros->precision).fUnion.increment.fIncrement + 4) =
               CONCAT44(local_50.fUnion._8_4_,local_50.fUnion._4_4_);
          *(undefined8 *)((long)&(macros->precision).fUnion + 0xc) = local_50._20_8_;
          (macros->precision).fType = local_50.fType;
          *(undefined4 *)&(macros->precision).field_0x4 = local_50._4_4_;
          (macros->precision).fUnion.fracSig = FVar1;
          return (uint)(stem == STEM_PRECISION_INTEGER) * 2;
        }
        break;
      case STEM_ROUNDING_MODE_CEILING:
      case STEM_ROUNDING_MODE_FLOOR:
      case STEM_ROUNDING_MODE_DOWN:
      case STEM_ROUNDING_MODE_UP:
      case STEM_ROUNDING_MODE_HALF_EVEN:
      case STEM_ROUNDING_MODE_HALF_DOWN:
      case STEM_ROUNDING_MODE_HALF_UP:
      case STEM_ROUNDING_MODE_UNNECESSARY:
        if (seen->roundingMode != true) {
          seen->roundingMode = true;
          UVar4 = stem_to_object::roundingMode(stem);
          macros->roundingMode = UVar4;
          return STATE_NULL;
        }
        break;
      case STEM_GROUP_OFF:
      case STEM_GROUP_MIN2:
      case STEM_GROUP_AUTO:
      case STEM_GROUP_ON_ALIGNED:
      case STEM_GROUP_THOUSANDS:
        if (seen->grouper != true) {
          seen->grouper = true;
          grouping = stem_to_object::groupingStrategy(stem);
          GVar9 = Grouper::forStrategy(grouping);
          macros->grouper = GVar9;
          return STATE_NULL;
        }
        break;
      case STEM_LATIN:
        if (seen->symbols != true) {
          seen->symbols = true;
          ns = NumberingSystem::createInstanceByName("latn",status);
          SymbolsWrapper::setTo(&macros->symbols,ns);
          return STATE_NULL;
        }
        break;
      case STEM_UNIT_WIDTH_NARROW:
      case STEM_UNIT_WIDTH_SHORT:
      case STEM_UNIT_WIDTH_FULL_NAME:
      case STEM_UNIT_WIDTH_ISO_CODE:
      case STEM_UNIT_WIDTH_HIDDEN:
        if (seen->unitWidth != true) {
          seen->unitWidth = true;
          UVar6 = stem_to_object::unitWidth(stem);
          macros->unitWidth = UVar6;
          return STATE_NULL;
        }
        break;
      case STEM_SIGN_AUTO:
      case STEM_SIGN_ALWAYS:
      case STEM_SIGN_NEVER:
      case STEM_SIGN_ACCOUNTING:
      case STEM_SIGN_ACCOUNTING_ALWAYS:
      case STEM_SIGN_EXCEPT_ZERO:
      case STEM_SIGN_ACCOUNTING_EXCEPT_ZERO:
        if (seen->sign != true) {
          seen->sign = true;
          UVar5 = stem_to_object::signDisplay(stem);
          macros->sign = UVar5;
          return STATE_NULL;
        }
        break;
      case STEM_DECIMAL_AUTO:
      case STEM_DECIMAL_ALWAYS:
        if (seen->decimal != true) {
          seen->decimal = true;
          UVar7 = (stem != STEM_DECIMAL_ALWAYS) + UNUM_DECIMAL_SEPARATOR_ALWAYS;
          if (stem == STEM_DECIMAL_AUTO) {
            UVar7 = UNUM_DECIMAL_SEPARATOR_AUTO;
          }
          macros->decimal = UVar7;
          return STATE_NULL;
        }
        break;
      case STEM_PRECISION_INCREMENT:
        if (seen->precision != true) {
          seen->precision = true;
          return STATE_INCREMENT_PRECISION;
        }
        break;
      case STEM_MEASURE_UNIT:
        if (seen->unit != true) {
          seen->unit = true;
          return STATE_MEASURE_UNIT;
        }
        break;
      case STEM_PER_MEASURE_UNIT:
        if (seen->perUnit != true) {
          seen->perUnit = true;
          return STATE_PER_MEASURE_UNIT;
        }
        break;
      case STEM_CURRENCY:
        if (seen->unit != true) {
          seen->unit = true;
          return STATE_CURRENCY_UNIT;
        }
        break;
      case STEM_INTEGER_WIDTH:
        if (seen->integerWidth != true) {
          seen->integerWidth = true;
          return STATE_INTEGER_WIDTH;
        }
        break;
      case STEM_NUMBERING_SYSTEM:
        if (seen->symbols != true) {
          seen->symbols = true;
          return STATE_NUMBERING_SYSTEM;
        }
        break;
      case STEM_SCALE:
        if (seen->scale != true) {
          seen->scale = true;
          return STATE_SCALE;
        }
        break;
      default:
        return STATE_NULL;
      }
      *status = U_NUMBER_SKELETON_SYNTAX_ERROR;
      return STATE_NULL;
    }
  }
  *status = U_NUMBER_SKELETON_SYNTAX_ERROR;
  return STATE_NULL;
}

Assistant:

ParseState
skeleton::parseStem(const StringSegment& segment, const UCharsTrie& stemTrie, SeenMacroProps& seen,
                    MacroProps& macros, UErrorCode& status) {
    // First check for "blueprint" stems, which start with a "signal char"
    switch (segment.charAt(0)) {
        case u'.':
        CHECK_NULL(seen, precision, status);
            blueprint_helpers::parseFractionStem(segment, macros, status);
            return STATE_FRACTION_PRECISION;
        case u'@':
        CHECK_NULL(seen, precision, status);
            blueprint_helpers::parseDigitsStem(segment, macros, status);
            return STATE_NULL;
        default:
            break;
    }

    // Now look at the stemsTrie, which is already be pointing at our stem.
    UStringTrieResult stemResult = stemTrie.current();

    if (stemResult != USTRINGTRIE_INTERMEDIATE_VALUE && stemResult != USTRINGTRIE_FINAL_VALUE) {
        // throw new SkeletonSyntaxException("Unknown stem", segment);
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return STATE_NULL;
    }

    auto stem = static_cast<StemEnum>(stemTrie.getValue());
    switch (stem) {

        // Stems with meaning on their own, not requiring an option:

        case STEM_COMPACT_SHORT:
        case STEM_COMPACT_LONG:
        case STEM_SCIENTIFIC:
        case STEM_ENGINEERING:
        case STEM_NOTATION_SIMPLE:
        CHECK_NULL(seen, notation, status);
            macros.notation = stem_to_object::notation(stem);
            switch (stem) {
                case STEM_SCIENTIFIC:
                case STEM_ENGINEERING:
                    return STATE_SCIENTIFIC; // allows for scientific options
                default:
                    return STATE_NULL;
            }

        case STEM_BASE_UNIT:
        case STEM_PERCENT:
        case STEM_PERMILLE:
        CHECK_NULL(seen, unit, status);
            macros.unit = stem_to_object::unit(stem);
            return STATE_NULL;

        case STEM_PRECISION_INTEGER:
        case STEM_PRECISION_UNLIMITED:
        case STEM_PRECISION_CURRENCY_STANDARD:
        case STEM_PRECISION_CURRENCY_CASH:
        CHECK_NULL(seen, precision, status);
            macros.precision = stem_to_object::precision(stem);
            switch (stem) {
                case STEM_PRECISION_INTEGER:
                    return STATE_FRACTION_PRECISION; // allows for "precision-integer/@##"
                default:
                    return STATE_NULL;
            }

        case STEM_ROUNDING_MODE_CEILING:
        case STEM_ROUNDING_MODE_FLOOR:
        case STEM_ROUNDING_MODE_DOWN:
        case STEM_ROUNDING_MODE_UP:
        case STEM_ROUNDING_MODE_HALF_EVEN:
        case STEM_ROUNDING_MODE_HALF_DOWN:
        case STEM_ROUNDING_MODE_HALF_UP:
        case STEM_ROUNDING_MODE_UNNECESSARY:
        CHECK_NULL(seen, roundingMode, status);
            macros.roundingMode = stem_to_object::roundingMode(stem);
            return STATE_NULL;

        case STEM_GROUP_OFF:
        case STEM_GROUP_MIN2:
        case STEM_GROUP_AUTO:
        case STEM_GROUP_ON_ALIGNED:
        case STEM_GROUP_THOUSANDS:
        CHECK_NULL(seen, grouper, status);
            macros.grouper = Grouper::forStrategy(stem_to_object::groupingStrategy(stem));
            return STATE_NULL;

        case STEM_LATIN:
        CHECK_NULL(seen, symbols, status);
            macros.symbols.setTo(NumberingSystem::createInstanceByName("latn", status));
            return STATE_NULL;

        case STEM_UNIT_WIDTH_NARROW:
        case STEM_UNIT_WIDTH_SHORT:
        case STEM_UNIT_WIDTH_FULL_NAME:
        case STEM_UNIT_WIDTH_ISO_CODE:
        case STEM_UNIT_WIDTH_HIDDEN:
        CHECK_NULL(seen, unitWidth, status);
            macros.unitWidth = stem_to_object::unitWidth(stem);
            return STATE_NULL;

        case STEM_SIGN_AUTO:
        case STEM_SIGN_ALWAYS:
        case STEM_SIGN_NEVER:
        case STEM_SIGN_ACCOUNTING:
        case STEM_SIGN_ACCOUNTING_ALWAYS:
        case STEM_SIGN_EXCEPT_ZERO:
        case STEM_SIGN_ACCOUNTING_EXCEPT_ZERO:
        CHECK_NULL(seen, sign, status);
            macros.sign = stem_to_object::signDisplay(stem);
            return STATE_NULL;

        case STEM_DECIMAL_AUTO:
        case STEM_DECIMAL_ALWAYS:
        CHECK_NULL(seen, decimal, status);
            macros.decimal = stem_to_object::decimalSeparatorDisplay(stem);
            return STATE_NULL;

            // Stems requiring an option:

        case STEM_PRECISION_INCREMENT:
        CHECK_NULL(seen, precision, status);
            return STATE_INCREMENT_PRECISION;

        case STEM_MEASURE_UNIT:
        CHECK_NULL(seen, unit, status);
            return STATE_MEASURE_UNIT;

        case STEM_PER_MEASURE_UNIT:
        CHECK_NULL(seen, perUnit, status);
            return STATE_PER_MEASURE_UNIT;

        case STEM_CURRENCY:
        CHECK_NULL(seen, unit, status);
            return STATE_CURRENCY_UNIT;

        case STEM_INTEGER_WIDTH:
        CHECK_NULL(seen, integerWidth, status);
            return STATE_INTEGER_WIDTH;

        case STEM_NUMBERING_SYSTEM:
        CHECK_NULL(seen, symbols, status);
            return STATE_NUMBERING_SYSTEM;

        case STEM_SCALE:
        CHECK_NULL(seen, scale, status);
            return STATE_SCALE;

        default:
            U_ASSERT(false);
            return STATE_NULL; // return a value: silence compiler warning
    }
}